

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::HandleBlockSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  allocator local_99;
  string local_98;
  Token token;
  
  Scanner::pop(this->m_scanner);
  CollectionStack::PushCollectionType
            ((this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl,BlockSeq);
  do {
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      local_98._0_12_ = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string((string *)&token,"end of sequence not found",&local_99);
      ParserException::ParserException(pPVar3,(Mark *)&local_98,(string *)&token);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    Token::Token(&token,pTVar2);
    if ((token.type & ~DOC_END) != BLOCK_SEQ_END) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      std::__cxx11::string::string((string *)&local_98,"end of sequence not found",&local_99);
      ParserException::ParserException(pPVar3,&token.mark,&local_98);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    Scanner::pop(this->m_scanner);
    if (token.type == BLOCK_SEQ_END) {
      Token::~Token(&token);
      std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
      pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
               (this->m_pCollectionStack)._M_t.
               super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
               .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
      return;
    }
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
LAB_006ab2ed:
      HandleNode(this,eventHandler);
    }
    else {
      pTVar2 = Scanner::peek(this->m_scanner);
      if ((pTVar2->type | DOC_END) != BLOCK_ENTRY) goto LAB_006ab2ed;
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,&pTVar2->mark,0);
    }
    Token::~Token(&token);
  } while( true );
}

Assistant:

void SingleDocParser::HandleBlockSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ);

    Token token = m_scanner.peek();
    if (token.type != Token::BLOCK_ENTRY && token.type != Token::BLOCK_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ);

    m_scanner.pop();
    if (token.type == Token::BLOCK_SEQ_END)
      break;

    // check for null
    if (!m_scanner.empty()) {
      const Token& nextToken = m_scanner.peek();
      if (nextToken.type == Token::BLOCK_ENTRY ||
          nextToken.type == Token::BLOCK_SEQ_END) {
        eventHandler.OnNull(nextToken.mark, NullAnchor);
        continue;
      }
    }

    HandleNode(eventHandler);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockSeq);
}